

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O1

shared_ptr<duckdb::ArrowArrayWrapper,_true> __thiscall
duckdb::ArrowArrayStreamWrapper::GetNextChunk(ArrowArrayStreamWrapper *this)

{
  code *pcVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ArrowArrayWrapper *pAVar3;
  InvalidInputException *this_01;
  char *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> sVar5;
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0249eb78;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this->_vptr_ArrowArrayStreamWrapper = (_func_int **)(this_00 + 1);
  (this->arrow_array_stream).get_schema = (_func_int_ArrowArrayStream_ptr_ArrowSchema_ptr *)this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  pcVar1 = *(code **)(in_RSI + 0x10);
  pAVar3 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->
                     ((shared_ptr<duckdb::ArrowArrayWrapper,_true> *)this);
  iVar2 = (*pcVar1)(in_RSI + 8,pAVar3);
  if (iVar2 == 0) {
    sVar5.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this;
    return (shared_ptr<duckdb::ArrowArrayWrapper,_true>)
           sVar5.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"arrow_scan: get_next failed(): %s","");
  pcVar4 = (char *)(**(code **)(in_RSI + 0x18))(in_RSI + 8);
  ::std::__cxx11::string::string((string *)&local_50,pcVar4,&local_71);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this_01,&local_70,&local_50);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<ArrowArrayWrapper> ArrowArrayStreamWrapper::GetNextChunk() {
	auto current_chunk = make_shared_ptr<ArrowArrayWrapper>();
	if (arrow_array_stream.get_next(&arrow_array_stream, &current_chunk->arrow_array)) { // LCOV_EXCL_START
		throw InvalidInputException("arrow_scan: get_next failed(): %s", string(GetError()));
	} // LCOV_EXCL_STOP

	return current_chunk;
}